

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::FindInitializationErrors
               (Message *message,string *prefix,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors)

{
  FieldDescriptor *this;
  char cVar1;
  int iVar2;
  Type TVar3;
  undefined4 extraout_var;
  long *plVar5;
  Message *pMVar6;
  ulong uVar7;
  long lVar8;
  int index;
  long lVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  string *local_60;
  void *local_58;
  void *pvStack_50;
  long local_48;
  ulong local_38;
  long lVar4;
  undefined4 extraout_var_00;
  
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors;
  local_60 = prefix;
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
  if (0 < *(int *)(lVar4 + 0x2c)) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if ((*(int *)(*(long *)(lVar4 + 0x30) + 0x4c + lVar8) == 2) &&
         (cVar1 = (**(code **)(*plVar5 + 0x28))(plVar5,message,*(long *)(lVar4 + 0x30) + lVar8),
         cVar1 == '\0')) {
        std::operator+(&local_88,local_60,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(lVar4 + 0x30) + lVar8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_68,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar9 < *(int *)(lVar4 + 0x2c));
  }
  local_58 = (void *)0x0;
  pvStack_50 = (void *)0x0;
  local_48 = 0;
  (**(code **)(*plVar5 + 0x80))(plVar5,message);
  if (pvStack_50 != local_58) {
    uVar7 = 0;
    do {
      this = *(FieldDescriptor **)((long)local_58 + uVar7 * 8);
      local_38 = uVar7;
      TVar3 = FieldDescriptor::type(this);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
        if (*(int *)(this + 0x4c) == 3) {
          iVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,message,this);
          if (0 < iVar2) {
            index = 0;
            do {
              pMVar6 = (Message *)(**(code **)(*plVar5 + 0x1a0))(plVar5,message,this,index);
              SubMessagePrefix(&local_88,local_60,this,index);
              FindInitializationErrors
                        (pMVar6,&local_88,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              index = index + 1;
            } while (iVar2 != index);
          }
        }
        else {
          pMVar6 = (Message *)(**(code **)(*plVar5 + 0xd8))(plVar5,message,this,0);
          SubMessagePrefix(&local_88,local_60,this,-1);
          FindInitializationErrors
                    (pMVar6,&local_88,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar7 = local_38 + 1;
    } while (uVar7 < (ulong)((long)pvStack_50 - (long)local_58 >> 3));
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

void ReflectionOps::FindInitializationErrors(
    const Message& message,
    const string& prefix,
    std::vector<string>* errors) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        errors->push_back(prefix + descriptor->field(i)->name());
      }
    }
  }

  // Check sub-messages.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, field, j);
          FindInitializationErrors(sub_message,
                                   SubMessagePrefix(prefix, field, j),
                                   errors);
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, field);
        FindInitializationErrors(sub_message,
                                 SubMessagePrefix(prefix, field, -1),
                                 errors);
      }
    }
  }
}